

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

int SDT::getTypeWidth(string *type)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  reference pcVar5;
  ostream *poVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_68;
  char t_1;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  int num;
  undefined1 local_40 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> t;
  string *type_local;
  
  t._32_8_ = type;
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)type);
  if (*pcVar4 == 'i') {
    type_local._4_4_ = 4;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::operator[](t._32_8_);
    if (*pcVar4 == 'c') {
      type_local._4_4_ = 1;
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[](t._32_8_);
      if (*pcVar4 == 'f') {
        type_local._4_4_ = 4;
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[](t._32_8_);
        if (*pcVar4 == 'd') {
          type_local._4_4_ = 8;
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[](t._32_8_);
          if (*pcVar4 == 'a') {
            divideType((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_40,(string *)t._32_8_);
            iVar3 = getTypeWidth((string *)&t);
            type_local._4_4_ = local_40._0_4_ * iVar3;
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_40);
          }
          else {
            pcVar4 = (char *)std::__cxx11::string::operator[](t._32_8_);
            if (*pcVar4 == 's') {
              __range2._0_4_ = 0;
              __end2._M_current = (char *)std::__cxx11::string::begin();
              _Stack_68._M_current = (char *)std::__cxx11::string::end();
              while( true ) {
                bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff98);
                if (!bVar2) break;
                pcVar5 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&__end2);
                cVar1 = *pcVar5;
                if (('/' < cVar1) && (cVar1 < ':')) {
                  __range2._0_4_ = (int)__range2 * 10 + cVar1 + -0x30;
                }
                __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&__end2);
              }
              type_local._4_4_ = (int)__range2;
            }
            else {
              poVar6 = std::operator<<((ostream *)&std::cout,"Get width of ");
              poVar6 = std::operator<<(poVar6,(string *)t._32_8_);
              poVar6 = std::operator<<(poVar6," ERROR");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              type_local._4_4_ = -1;
            }
          }
        }
      }
    }
  }
  return type_local._4_4_;
}

Assistant:

int getTypeWidth(const string &type){
        if(type[0]=='i') return 4;
        if(type[0]=='c') return 1;
        if(type[0]=='f') return 4;
        if(type[0]=='d') return 8;
        if(type[0]=='a'){
            auto t = divideType(type);
            return t.first*getTypeWidth(t.second);
        }
        if(type[0]=='s'){
            int num = 0;
            for(char t:type){
                if(t>='0'&&t<='9') num = num*10 + (t-'0');
            }
            return num;
        }
        cout<<"Get width of "<<type<<" ERROR"<<endl;
        return -1;
    }